

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O3

void gimage::imageToColor<float,gimage::PixelTraits<float>>
               (Image<float,_gimage::PixelTraits<float>_> *ret,
               Image<float,_gimage::PixelTraits<float>_> *image)

{
  float fVar1;
  long lVar2;
  long lVar3;
  float ***pppfVar4;
  float ***pppfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  long lVar10;
  long lVar11;
  
  Image<float,_gimage::PixelTraits<float>_>::setSize(ret,image->width,image->height,3);
  lVar2 = image->height;
  if (0 < lVar2) {
    lVar3 = image->width;
    pppfVar4 = image->img;
    pppfVar5 = ret->img;
    lVar11 = 0;
    do {
      if (0 < lVar3) {
        pfVar6 = (*pppfVar4)[lVar11];
        pfVar7 = (*pppfVar5)[lVar11];
        pfVar8 = pppfVar5[1][lVar11];
        pfVar9 = pppfVar5[2][lVar11];
        lVar10 = 0;
        do {
          fVar1 = pfVar6[lVar10];
          pfVar7[lVar10] = fVar1;
          pfVar8[lVar10] = fVar1;
          pfVar9[lVar10] = pfVar6[lVar10];
          lVar10 = lVar10 + 1;
        } while (lVar3 != lVar10);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != lVar2);
  }
  return;
}

Assistant:

void imageToColor(Image<T, traits> &ret, const Image<T, traits> &image)
{
  assert(image.getDepth() == 1);

  ret.setSize(image.getWidth(), image.getHeight(), 3);

  for (long k=0; k<image.getHeight(); k++)
  {
    for (long i=0; i<image.getWidth(); i++)
    {
      ret.set(i, k, 0, image.get(i, k, 0));
      ret.set(i, k, 1, image.get(i, k, 0));
      ret.set(i, k, 2, image.get(i, k, 0));
    }
  }
}